

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::HasHasbitTest_TestHasHasbitExplicitPresence_Test::
~HasHasbitTest_TestHasHasbitExplicitPresence_Test
          (HasHasbitTest_TestHasHasbitExplicitPresence_Test *this)

{
  (this->super_HasHasbitTest).
  super_TestWithParam<google::protobuf::descriptor_unittest::HasHasbitTestParam>.super_Test.
  _vptr_Test = (_func_int **)&PTR__HasHasbitTest_018e1dd8;
  (this->super_HasHasbitTest).
  super_TestWithParam<google::protobuf::descriptor_unittest::HasHasbitTestParam>.
  super_WithParamInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>.
  _vptr_WithParamInterface = (_func_int **)&DAT_018e1e18;
  FileDescriptorProto::~FileDescriptorProto(&(this->super_HasHasbitTest).foo_proto_);
  DescriptorPool::~DescriptorPool(&(this->super_HasHasbitTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_P(HasHasbitTest, TestHasHasbitExplicitPresence) {
  EXPECT_EQ(GetField()->has_presence(),
            GetParam().expected_output.expected_has_presence);
  EXPECT_EQ(GetFieldHasbitMode(GetField()),
            GetParam().expected_output.expected_hasbitmode);
  EXPECT_EQ(HasHasbit(GetField()),
            GetParam().expected_output.expected_has_hasbit);
}